

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::Path::toString
          (string *__return_storage_ptr__,Path *this,string *directoryPathSeparator)

{
  size_t __n;
  int iVar1;
  Path *this_00;
  string path;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (Path *)(this->path_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,this_00,
             (pointer)((long)&(this_00->path_)._M_dataplus._M_p + (this->path_)._M_string_length));
  removeRedundantDirectorySeparators(&local_88,this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  __n = (this->separator_)._M_string_length;
  if (__n == directoryPathSeparator->_M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((this->separator_)._M_dataplus._M_p,(directoryPathSeparator->_M_dataplus)._M_p,
                   __n);
      if (iVar1 != 0) goto LAB_0013d56c;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
LAB_0013d56c:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    StringUtils::replaceAll
              ((string *)__return_storage_ptr__,&local_68,(string *)&this->separator_,
               (string *)directoryPathSeparator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Path::toString(const std::string& directoryPathSeparator) const
    {
        std::string path = removeRedundantDirectorySeparators(path_);

        if (separator_ == directoryPathSeparator)
        {
            return path;
        }
        return StringUtils::replaceAll(path, separator_, directoryPathSeparator);
    }